

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnscentedKalmanFilter.h
# Opt level: O0

void __thiscall UnscentedKalmanFilter::~UnscentedKalmanFilter(UnscentedKalmanFilter *this)

{
  UnscentedKalmanFilter *this_local;
  
  ~UnscentedKalmanFilter(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~UnscentedKalmanFilter() {}